

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O0

void gameboy_sound_set_mute_mask(void *chip,UINT32 MuteMask)

{
  gb_sound_t *gb;
  UINT32 MuteMask_local;
  void *chip_local;
  
  *(byte *)((long)chip + 0x3e) = (byte)MuteMask & 1;
  *(byte *)((long)chip + 0x72) = (byte)(MuteMask >> 1) & 1;
  *(byte *)((long)chip + 0xa6) = (byte)(MuteMask >> 2) & 1;
  *(byte *)((long)chip + 0xda) = (byte)(MuteMask >> 3) & 1;
  return;
}

Assistant:

static void gameboy_sound_set_mute_mask(void *chip, UINT32 MuteMask)
{
	gb_sound_t *gb = (gb_sound_t *)chip;
	
	gb->snd_1.Muted = (MuteMask >> 0) & 0x01;
	gb->snd_2.Muted = (MuteMask >> 1) & 0x01;
	gb->snd_3.Muted = (MuteMask >> 2) & 0x01;
	gb->snd_4.Muted = (MuteMask >> 3) & 0x01;
	
	return;
}